

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtest.cpp
# Opt level: O0

void DumpMetaData(PtexMetaData *meta)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  pointer ppVar5;
  DumpMetaArrayVal<signed_char> *this;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  *this_00;
  long *in_RDI;
  char *val;
  MetaDataType type_1;
  char *key_1;
  iterator iter;
  MetaDataType type;
  char *key;
  int i;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  sortedkeys;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *in_stack_fffffffffffffec8;
  ostream *in_stack_fffffffffffffed0;
  allocator<char> *in_stack_ffffffffffffff00;
  long *plVar6;
  key_type *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  char *local_b8;
  MetaDataType local_ac;
  char *local_a8;
  _Self local_a0;
  _Base_ptr local_98;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  local_90;
  allocator<char> local_81;
  string local_80 [36];
  undefined1 local_5c [4];
  undefined1 local_58 [28];
  int local_3c;
  long *local_8;
  
  local_8 = in_RDI;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         *)0x1059dc);
  for (local_3c = 0; iVar1 = local_3c, iVar3 = (**(code **)(*local_8 + 0x18))(), iVar1 < iVar3;
      local_3c = local_3c + 1) {
    (**(code **)(*local_8 + 0x20))(local_8,local_3c,local_58,local_5c);
    iVar1 = local_3c;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff00
              );
    in_stack_ffffffffffffff10 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    *(int *)in_stack_ffffffffffffff10 = iVar1;
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator(&local_81);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"meta:");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  ::_Rb_tree_iterator(&local_90);
  local_98 = (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::begin(in_stack_fffffffffffffec8);
  local_90._M_node = local_98;
  while( true ) {
    local_a0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         ::end(in_stack_fffffffffffffec8);
    bVar2 = std::operator!=(&local_90,&local_a0);
    if (!bVar2) break;
    plVar6 = local_8;
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                           *)0x105beb);
    (**(code **)(*plVar6 + 0x20))(plVar6,ppVar5->second,&local_a8,&local_ac);
    poVar4 = std::operator<<((ostream *)&std::cout,"  ");
    poVar4 = std::operator<<(poVar4,local_a8);
    poVar4 = std::operator<<(poVar4," type=");
    this = (DumpMetaArrayVal<signed_char> *)Ptex::v2_4::MetaDataTypeName(local_ac);
    std::operator<<(poVar4,(char *)this);
    this_00 = (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
               *)(ulong)local_ac;
    switch(this_00) {
    case (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
          *)0x0:
      local_b8 = (char *)0x0;
      (**(code **)(*local_8 + 0x30))(local_8,local_a8,&local_b8);
      in_stack_fffffffffffffed0 = std::operator<<((ostream *)&std::cout,"  ");
      std::operator<<(in_stack_fffffffffffffed0,local_b8);
      break;
    case (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
          *)0x1:
      DumpMetaArrayVal<signed_char>::operator()
                (this,(PtexMetaData *)this_00,(char *)in_stack_fffffffffffffed0);
      break;
    case (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
          *)0x2:
      DumpMetaArrayVal<short>::operator()
                ((DumpMetaArrayVal<short> *)this,(PtexMetaData *)this_00,
                 (char *)in_stack_fffffffffffffed0);
      break;
    case (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
          *)0x3:
      DumpMetaArrayVal<int>::operator()
                ((DumpMetaArrayVal<int> *)this,(PtexMetaData *)this_00,
                 (char *)in_stack_fffffffffffffed0);
      break;
    case (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
          *)0x4:
      DumpMetaArrayVal<float>::operator()
                ((DumpMetaArrayVal<float> *)this,(PtexMetaData *)this_00,
                 (char *)in_stack_fffffffffffffed0);
      break;
    case (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
          *)0x5:
      DumpMetaArrayVal<double>::operator()
                ((DumpMetaArrayVal<double> *)this,(PtexMetaData *)this_00,
                 (char *)in_stack_fffffffffffffed0);
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
    ::operator++(this_00,(int)((ulong)in_stack_fffffffffffffed0 >> 0x20));
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *)0x105ddd);
  return;
}

Assistant:

void DumpMetaData(PtexMetaData* meta)
{
    // Sort the meta keys before printing them out because the
    // internal key order may change depending on whether large meta
    // data support was included.  Normally the key order shouldn't
    // matter, but we don't want it to cause the regression test to fail.

    std::map<std::string,int> sortedkeys;
    for (int i = 0; i < meta->numKeys(); i++)
    {
        const char* key;
        Ptex::MetaDataType type;
        meta->getKey(i, key, type);
        sortedkeys[key] = i;
    }

    std::cout << "meta:" << std::endl;
    std::map<std::string,int>::iterator iter;
    for (iter = sortedkeys.begin(); iter != sortedkeys.end(); iter++) {
        const char* key;
        Ptex::MetaDataType type;
        meta->getKey(iter->second, key, type);
        std::cout << "  " << key << " type=" << Ptex::MetaDataTypeName(type);
        switch (type) {
        case Ptex::mdt_string:
            {
                const char* val=0;
                meta->getValue(key, val);
                std::cout <<  "  " << val;
            }
            break;
        case Ptex::mdt_int8:   DumpMetaArrayVal<int8_t>()(meta, key); break;
        case Ptex::mdt_int16:  DumpMetaArrayVal<int16_t>()(meta, key); break;
        case Ptex::mdt_int32:  DumpMetaArrayVal<int32_t>()(meta, key); break;
        case Ptex::mdt_float:  DumpMetaArrayVal<float>()(meta, key); break;
        case Ptex::mdt_double: DumpMetaArrayVal<double>()(meta, key); break;
        }
        std::cout << std::endl;
    }
}